

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::parseJsonInto
          (QMakeEvaluator *this,QByteArray *json,QString *into,ProValueMap *value)

{
  ulong uVar1;
  QJsonObject *in_RCX;
  QString *in_RDX;
  QJsonParseError *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_QLatin1Char> QVar2;
  QByteArrayView QVar3;
  QString currentKey;
  ErrorPosition errorPos;
  QJsonDocument document;
  QJsonParseError error;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  QMakeEvaluator *in_stack_fffffffffffffea0;
  QString *in_stack_fffffffffffffea8;
  QString *a;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int fieldWidth;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  QString *keyPrefix;
  undefined4 in_stack_fffffffffffffeec;
  QChar fillChar;
  VisitReturn VVar4;
  QJsonObject local_110 [8];
  QJsonArray local_108 [8];
  QString *local_100;
  char local_f8;
  undefined1 local_e9 [39];
  QChar local_c2 [15];
  QChar local_a4;
  QChar local_a2;
  storage_type *local_a0;
  undefined1 local_90 [96];
  ErrorPosition local_30;
  undefined8 local_28;
  QJsonParseError local_20;
  QString *local_18;
  char local_10;
  long local_8;
  
  fillChar.ucs = (char16_t)((uint)in_stack_fffffffffffffeec >> 0x10);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.offset = -0x55555556;
  local_20.error = 0xaaaaaaaa;
  QJsonParseError::QJsonParseError(&local_20);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QJsonDocument::fromJson((QByteArray *)&local_28,in_RSI);
  uVar1 = QJsonDocument::isNull();
  if ((uVar1 & 1) != 0) {
    if (local_20.error != NoError) {
      local_30.line = -0x55555556;
      local_30.column = -0x55555556;
      local_30 = calculateErrorPosition
                           ((QByteArray *)
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                            (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      QByteArrayView::QByteArrayView<32ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (char (*) [32])in_stack_fffffffffffffea8);
      QVar3.m_data = local_a0;
      QVar3.m_size = (qsizetype)local_90;
      QString::fromLatin1(QVar3);
      QChar::QChar<char16_t,_true>(&local_a2,L' ');
      QString::arg<int,_true>
                (in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                 (int)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 (QChar)(char16_t)((ulong)in_RDI >> 0x30));
      fieldWidth = local_30.column;
      QChar::QChar<char16_t,_true>(&local_a4,L' ');
      QString::arg<int,_true>
                (in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                 (int)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 (QChar)(char16_t)((ulong)in_RDI >> 0x30));
      QJsonParseError::errorString();
      QChar::QChar<char16_t,_true>(local_c2,L' ');
      QString::arg<QString,_true>
                ((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_RDI,
                 fieldWidth,fillChar);
      evalError(in_stack_fffffffffffffea0,
                (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      QString::~QString((QString *)0x2c6938);
      QString::~QString((QString *)0x2c6945);
      QString::~QString((QString *)0x2c6952);
      QString::~QString((QString *)0x2c695f);
      QString::~QString((QString *)0x2c696c);
    }
    VVar4 = ReturnFalse;
    goto LAB_002c6ac6;
  }
  local_e9._1_8_ = 0xaaaaaaaaaaaaaaaa;
  local_e9._9_8_ = 0xaaaaaaaaaaaaaaaa;
  local_e9._17_8_ = 0xaaaaaaaaaaaaaaaa;
  a = (QString *)local_e9;
  keyPrefix = in_RDX;
  QLatin1Char::QLatin1Char((QLatin1Char *)a,'.');
  QVar2 = ::operator+(a,(QLatin1Char *)in_RDX);
  local_100 = QVar2.a;
  local_f8 = (char)QVar2.b.ch;
  local_18 = local_100;
  local_10 = local_f8;
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<const_QString_&,_QLatin1Char> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  uVar1 = QJsonDocument::isArray();
  if ((uVar1 & 1) == 0) {
    uVar1 = QJsonDocument::isObject();
    if ((uVar1 & 1) != 0) {
      QJsonDocument::object();
      addJsonObject(in_RCX,(QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    (ProValueMap *)in_RDI);
      QJsonObject::~QJsonObject(local_110);
      goto LAB_002c6aa9;
    }
    VVar4 = ReturnFalse;
  }
  else {
    QJsonDocument::array();
    addJsonArray((QJsonArray *)in_RSI,keyPrefix,(ProValueMap *)in_RCX);
    QJsonArray::~QJsonArray(local_108);
LAB_002c6aa9:
    VVar4 = ReturnTrue;
  }
  QString::~QString((QString *)0x2c6ac6);
LAB_002c6ac6:
  QJsonDocument::~QJsonDocument((QJsonDocument *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return VVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::parseJsonInto(const QByteArray &json, const QString &into, ProValueMap *value)
{
    QJsonParseError error;
    QJsonDocument document = QJsonDocument::fromJson(json, &error);
    if (document.isNull()) {
        if (error.error != QJsonParseError::NoError) {
            ErrorPosition errorPos = calculateErrorPosition(json, error.offset);
            evalError(fL1S("Error parsing JSON at %1:%2: %3")
                      .arg(errorPos.line).arg(errorPos.column).arg(error.errorString()));
        }
        return QMakeEvaluator::ReturnFalse;
    }

    QString currentKey = into + QLatin1Char('.');

    // top-level item is either an array or object
    if (document.isArray())
        addJsonArray(document.array(), currentKey, value);
    else if (document.isObject())
        addJsonObject(document.object(), currentKey, value);
    else
        return QMakeEvaluator::ReturnFalse;

    return QMakeEvaluator::ReturnTrue;
}